

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (lock_threshold < 0.0) {
    lock_threshold = (GImGui->IO).MouseDragThreshold;
  }
  if ((((GImGui->IO).MouseDown[button] != false) || ((GImGui->IO).MouseReleased[button] == true)) &&
     (lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[button])) {
    IVar1 = (GImGui->IO).MousePos;
    fVar3 = IVar1.x;
    if ((-256000.0 <= fVar3) && (fVar4 = IVar1.y, -256000.0 <= fVar4)) {
      IVar1 = (GImGui->IO).MouseClickedPos[button];
      fVar5 = IVar1.x;
      if ((-256000.0 <= fVar5) && (fVar6 = IVar1.y, -256000.0 <= fVar6)) {
        IVar1.y = fVar4 - fVar6;
        IVar1.x = fVar3 - fVar5;
        return IVar1;
      }
    }
  }
  IVar2.x = 0.0;
  IVar2.y = 0.0;
  return IVar2;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}